

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall
IsorecursiveTest_ForwardReferencedChild_Test::TestBody
          (IsorecursiveTest_ForwardReferencedChild_Test *this)

{
  HeapType HVar1;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> uVar2;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> uVar3;
  AssertionResult *this_00;
  char *pcVar4;
  char *in_R9;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  undefined1 auStack_98 [8];
  BuildResult result;
  TypeBuilder local_70;
  TypeBuilder builder;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Entry local_38;
  AssertHelper local_28;
  
  wasm::TypeBuilder::TypeBuilder(&local_70,3);
  wasm::TypeBuilder::createRecGroup((ulong)&local_70,0);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 1
  ;
  auStack_98 = (undefined1  [8])&local_70;
  HVar1 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_98);
  uVar2._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )wasm::TypeBuilder::getTempRefType((HeapType)&local_70,(Nullability)HVar1.id);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 2
  ;
  auStack_98 = (undefined1  [8])&local_70;
  HVar1 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_98);
  uVar3._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )wasm::TypeBuilder::getTempRefType((HeapType)&local_70,(Nullability)HVar1.id);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x1000000;
  __l._M_len = 1;
  __l._M_array = (iterator)&builder;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       uVar2._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&gtest_ar_.message_,__l,
             (allocator_type *)&local_28);
  auStack_98 = (undefined1  [8])
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       gtest_ar._0_8_;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_38.index = 0;
  local_38.builder = &local_70;
  wasm::TypeBuilder::Entry::operator=(&local_38,(Struct *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&gtest_ar_.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x1000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&builder;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       uVar3._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&gtest_ar_.message_,__l_00,
             (allocator_type *)&local_28);
  auStack_98 = (undefined1  [8])
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       gtest_ar._0_8_;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  local_38.index = 1;
  local_38.builder = &local_70;
  wasm::TypeBuilder::Entry::operator=(&local_38,(Struct *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&gtest_ar_.message_);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ = 0
  ;
  auStack_98 = (undefined1  [8])0x0;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&local_70;
  wasm::TypeBuilder::Entry::operator=((Entry *)&gtest_ar_.message_,(Struct *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_98);
  wasm::TypeBuilder::build();
  this_00 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_1_ =
       result.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] != '\0';
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\0') {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&builder,(AssertionResult *)"result","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x124,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_38.builder != (TypeBuilder *)0x0) {
      (**(code **)((long)((local_38.builder)->impl)._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_1_ =
       result.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] == '\x01';
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\x01') {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 3;
    testing::internal::CmpHelperEQ<wasm::TypeBuilder::ErrorReason,wasm::TypeBuilder::ErrorReason>
              ((internal *)&gtest_ar_.message_,"error->reason",
               "TypeBuilder::ErrorReason::ForwardChildReference",(ErrorReason *)&result,
               (ErrorReason *)&builder);
    if ((char)gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl == '\0') {
      testing::Message::Message((Message *)&builder);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x128,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&gtest_ar_.message_,"error->index","1u",(unsigned_long *)auStack_98,
               (uint *)&builder);
    if ((char)gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl == '\0') {
      testing::Message::Message((Message *)&builder);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x129,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    this_00 = &gtest_ar;
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&builder,(AssertionResult *)"error","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x127,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_38.builder != (TypeBuilder *)0x0) {
      (**(code **)((long)((local_38.builder)->impl)._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)auStack_98);
  wasm::TypeBuilder::~TypeBuilder(&local_70);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, ForwardReferencedChild) {
  TypeBuilder builder(3);
  builder.createRecGroup(0, 2);
  Type refA1 = builder.getTempRefType(builder[1], Nullable);
  Type refB0 = builder.getTempRefType(builder[2], Nullable);
  // Forward reference to same group is ok.
  builder[0] = Struct({Field(refA1, Mutable)});
  // Forward reference to different group is not ok.
  builder[1] = Struct({Field(refB0, Mutable)});
  builder[2] = Struct{};

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::ForwardChildReference);
  EXPECT_EQ(error->index, 1u);
}